

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  char cVar1;
  char *pcVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  long in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  ptls_iovec_t pVar7;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t type;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint8_t *local_88;
  size_t local_80;
  ulong local_60;
  long local_58;
  ulong local_30;
  long local_28;
  int local_1c;
  
  local_28 = 2;
  if ((ulong)(in_RDX - *in_RSI) < 2) {
    local_1c = 0x32;
  }
  else {
    local_30 = 0;
    do {
      pbVar3 = (byte *)*in_RSI;
      *in_RSI = (long)(pbVar3 + 1);
      local_30 = local_30 << 8 | (ulong)*pbVar3;
      local_28 = local_28 + -1;
    } while (local_28 != 0);
    local_1c = 0;
    if ((ulong)(in_RDX - *in_RSI) < local_30) {
      local_1c = 0x32;
    }
    else {
      lVar4 = *in_RSI + local_30;
      if (*in_RSI == lVar4) {
        local_1c = 0x32;
      }
      else {
        do {
          pcVar2 = (char *)*in_RSI;
          *in_RSI = (long)(pcVar2 + 1);
          cVar1 = *pcVar2;
          local_58 = 2;
          if ((ulong)(lVar4 - *in_RSI) < 2) {
            return 0x32;
          }
          local_60 = 0;
          do {
            pbVar3 = (byte *)*in_RSI;
            *in_RSI = (long)(pbVar3 + 1);
            local_60 = local_60 << 8 | (ulong)*pbVar3;
            local_58 = local_58 + -1;
          } while (local_58 != 0);
          if ((ulong)(lVar4 - *in_RSI) < local_60) {
            return 0x32;
          }
          lVar5 = *in_RSI + local_60;
          if (cVar1 == '\0') {
            pvVar6 = memchr((void *)*in_RSI,0,lVar5 - *in_RSI);
            if (pvVar6 != (void *)0x0) {
              return 0x2f;
            }
            pVar7 = ptls_iovec_init((void *)*in_RSI,lVar5 - *in_RSI);
            local_88 = pVar7.base;
            *in_RDI = local_88;
            local_80 = pVar7.len;
            in_RDI[1] = local_80;
          }
          *in_RSI = lVar5;
          if (*in_RSI != lVar5) {
            return 0x32;
          }
        } while (*in_RSI != lVar4);
        if (*in_RSI != lVar4) {
          local_1c = 0x32;
        }
      }
    }
  }
  return local_1c;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *(*src)++;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}